

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

int32_t helicsDataBufferFillFromString(HelicsDataBuffer data,char *str)

{
  Message *pMVar1;
  byte *data_00;
  char *in_RCX;
  SmallBuffer *ptr;
  string_view val;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar1 == (Message *)0x0) {
      return 0;
    }
    data = &pMVar1->data;
  }
  data_00 = (byte *)strlen(str);
  helics::SmallBuffer::reserve((SmallBuffer *)data,(size_t)(data_00 + 8));
  ((SmallBuffer *)data)->bufferSize = (size_t)(data_00 + 8);
  val._M_str = in_RCX;
  val._M_len = (size_t)str;
  helics::detail::convertToBinary((detail *)((SmallBuffer *)data)->heap,data_00,val);
  return (int32_t)((SmallBuffer *)data)->bufferSize;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromString(HelicsDataBuffer data, const char* str)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<std::string_view>::convert(std::string_view(str), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}